

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticAnalyser.cpp
# Opt level: O3

Media * GetMediaAndPlatforms
                  (Media *__return_storage_ptr__,string *file_name,IntType *potential_platforms)

{
  int iVar1;
  uint uVar2;
  undefined8 *puVar3;
  Media *extraout_RAX;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extension;
  char *extension_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *extension_01;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *extraout_RDX_15;
  char *extension_02;
  char *extension_03;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *extraout_RDX_23;
  char *extraout_RDX_24;
  char *extraout_RDX_25;
  char *pcVar4;
  char *extension_04;
  char *extension_05;
  char *extraout_RDX_26;
  char *extraout_RDX_27;
  char *extraout_RDX_28;
  char *extension_06;
  DiskOrMassStorageDevice media;
  MediaAccumulator accumulator;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_280;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_278;
  undefined1 local_270;
  undefined1 local_26f;
  undefined1 local_26e;
  undefined1 local_26d;
  undefined1 local_26c;
  undefined1 local_26b;
  undefined1 local_26a;
  undefined1 local_269;
  undefined1 local_268;
  undefined1 local_267;
  undefined1 local_266;
  undefined1 local_265;
  undefined1 local_264;
  undefined1 local_263;
  undefined1 local_262;
  undefined1 local_261;
  undefined1 local_260;
  undefined1 local_25f;
  undefined1 local_25e;
  undefined1 local_25d;
  undefined1 local_25c;
  undefined1 local_25b;
  undefined1 local_25a;
  undefined1 local_259;
  undefined1 local_258 [24];
  vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  vStack_240;
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  local_228;
  vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  vStack_210;
  string *local_1f8;
  uint *local_1f0;
  string local_1e8;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_1c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1b8;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_1b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1a8;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_1a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_198;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_190;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_188;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_180;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_178;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_170;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_168;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_160;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_150;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_148;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_140;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_138;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_130;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_128;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_120;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_118;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_100;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_f8;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e8;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_e0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_d8;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_c8;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_b0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a8;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_98;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_90;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_88;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_80;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_78;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_70;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  _Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
  local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>_> local_40;
  
  vStack_210.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_210.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_228.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_210.
  super__Vector_base<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_228.
  super__Vector_base<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_240.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vStack_240.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_258._16_8_ = (pointer)0x0;
  vStack_240.
  super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_258._0_8_ = (pointer)0x0;
  local_258._8_8_ = (pointer)0x0;
  local_1f8 = file_name;
  local_1f0 = (uint *)potential_platforms;
  anon_unknown.dwarf_41c665::get_extension(&local_1e8,file_name);
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  pcVar4 = extraout_RDX;
  if (iVar1 == 0) {
    Storage::Disk::Disk2MG::open((char *)&local_280,(int)file_name);
    local_1c0 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )local_258;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<void>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Analyser/Static/StaticAnalyser.cpp:180:15)_&&,_const_std::variant<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>_&>
      ::_S_vtable._M_arr[(ulong)local_278 & 0xff]._M_data)
              ((anon_class_8_1_18cdd2e6 *)&local_1c0._M_first,
               (variant<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                *)&local_280._M_first);
    pcVar4 = extraout_RDX_00;
  }
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            ((MediaAccumulator *)local_258,0x460a31,pcVar4);
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            ((MediaAccumulator *)local_258,0x4d5d37,extension);
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_258,8,"a26");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AcornADF>>
            ((MediaAccumulator *)local_258,0x460a3c,extension_00);
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  pcVar4 = extraout_RDX_01;
  if (iVar1 == 0) {
    local_1b0 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::AmigaADF>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::AmigaADF>>,std::__cxx11::string_const&>
              (&local_1a8,(DiskImageHolder<Storage::Disk::AmigaADF> **)&local_1b0,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::AmigaADF>_> *)&local_270,
               local_1f8);
    local_280 = local_1b0;
    local_278 = local_1a8._M_pi;
    if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1a8._M_pi)->_M_use_count = (local_1a8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1a8._M_pi)->_M_use_count = (local_1a8._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    pcVar4 = extraout_RDX_02;
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
      pcVar4 = extraout_RDX_03;
    }
    *local_1f0 = *local_1f0 | 0x80;
    if (local_1b0 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_1b0 + 0x70))
                        ((undefined1 *)((long)local_1b0 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
      pcVar4 = extraout_RDX_04;
    }
    if (local_1a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1a8._M_pi);
      pcVar4 = extraout_RDX_05;
    }
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AcornADF>>
            ((MediaAccumulator *)local_258,0x460a40,pcVar4);
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_258,0x20848,"bin");
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_1a0 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Tape::CAS,std::allocator<Storage::Tape::CAS>,std::__cxx11::string_const&>
              (&local_198,(CAS **)&local_1a0,(allocator<Storage::Tape::CAS> *)&local_26f,local_1f8);
    local_280 = local_1a0;
    local_278 = local_198._M_pi;
    if (local_198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_198._M_pi)->_M_use_count = (local_198._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_198._M_pi)->_M_use_count = (local_198._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&vStack_240,(shared_ptr<Storage::Tape::Tape> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x20000;
    if (local_1a0 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_1a0,&Storage::Tape::CAS::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *local_1f0 = *local_1f0 & uVar2;
      }
    }
    if (local_198._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_198._M_pi);
    }
  }
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Tape::TZX>
            ((MediaAccumulator *)local_258,1,"cdt");
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_258,0x800,"col");
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_190 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Tape::CSW,std::allocator<Storage::Tape::CSW>,std::__cxx11::string_const&>
              (&local_188,(CSW **)&local_190,(allocator<Storage::Tape::CSW> *)&local_26e,local_1f8);
    local_280 = local_190;
    local_278 = local_188._M_pi;
    if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_188._M_pi)->_M_use_count = (local_188._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_188._M_pi)->_M_use_count = (local_188._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&vStack_240,(shared_ptr<Storage::Tape::Tape> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x3e1761;
    if (local_190 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_190,&Storage::Tape::CSW::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *local_1f0 = *local_1f0 & uVar2;
      }
    }
    if (local_188._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_188._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_180 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::D64>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::D64>>,std::__cxx11::string_const&>
              (&local_178,(DiskImageHolder<Storage::Disk::D64> **)&local_180,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::D64>_> *)&local_26d,
               local_1f8);
    local_280 = local_180;
    local_278 = local_178._M_pi;
    if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_178._M_pi)->_M_use_count = (local_178._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_178._M_pi)->_M_use_count = (local_178._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x1000;
    if (local_180 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_180 + 0x70))
                        ((undefined1 *)((long)local_180 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
    }
    if (local_178._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_178._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_170 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::MassStorage::DAT,std::allocator<Storage::MassStorage::DAT>,std::__cxx11::string_const&>
              (&local_168,(DAT **)&local_170,(allocator<Storage::MassStorage::DAT> *)&local_26c,
               local_1f8);
    local_280 = local_170;
    local_278 = local_168._M_pi;
    if (local_168._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_168._M_pi)->_M_use_count = (local_168._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_168._M_pi)->_M_use_count = (local_168._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
    ::emplace_back<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>
              ((vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
                *)&vStack_210,
               (shared_ptr<Storage::MassStorage::MassStorageDevice> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x760;
    if (local_170 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_170,&Storage::MassStorage::DAT::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *local_1f0 = *local_1f0 & uVar2;
      }
    }
    if (local_168._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_168._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  pcVar4 = extraout_RDX_06;
  if (iVar1 == 0) {
    local_160 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::DMK>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::DMK>>,std::__cxx11::string_const&>
              (&local_158,(DiskImageHolder<Storage::Disk::DMK> **)&local_160,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::DMK>_> *)&local_26b,
               local_1f8);
    local_280 = local_160;
    local_278 = local_158._M_pi;
    if (local_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_158._M_pi)->_M_use_count = (local_158._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_158._M_pi)->_M_use_count = (local_158._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    pcVar4 = extraout_RDX_07;
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
      pcVar4 = extraout_RDX_08;
    }
    *local_1f0 = *local_1f0 | 0x20000;
    if (local_160 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_160 + 0x70))
                        ((undefined1 *)((long)local_160 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
      pcVar4 = extraout_RDX_09;
    }
    if (local_158._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_158._M_pi);
      pcVar4 = extraout_RDX_10;
    }
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AppleDSK>>
            ((MediaAccumulator *)local_258,0x460a60,pcVar4);
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>>
            ((MediaAccumulator *)local_258,0x460a63,extension_01);
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  pcVar4 = extraout_RDX_11;
  if (iVar1 == 0) {
    local_150 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::CPCDSK>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::CPCDSK>>,std::__cxx11::string_const&>
              (&local_148,(DiskImageHolder<Storage::Disk::CPCDSK> **)&local_150,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::CPCDSK>_> *)&local_26a,
               local_1f8);
    local_280 = local_150;
    local_278 = local_148._M_pi;
    if (local_148._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_148._M_pi)->_M_use_count = (local_148._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_148._M_pi)->_M_use_count = (local_148._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    pcVar4 = extraout_RDX_12;
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
      pcVar4 = extraout_RDX_13;
    }
    *local_1f0 = *local_1f0 | 0x240001;
    if (local_150 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_150 + 0x70))
                        ((undefined1 *)((long)local_150 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
      pcVar4 = extraout_RDX_14;
    }
    if (local_148._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_148._M_pi);
      pcVar4 = extraout_RDX_15;
    }
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AppleDSK>>
            ((MediaAccumulator *)local_258,0x460a67,pcVar4);
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>
            ((MediaAccumulator *)local_258,0x460a67,extension_02);
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_140 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::MassStorage::HFV,std::allocator<Storage::MassStorage::HFV>,std::__cxx11::string_const&>
              (&local_138,(HFV **)&local_140,(allocator<Storage::MassStorage::HFV> *)&local_269,
               local_1f8);
    local_280 = local_140;
    local_278 = local_138._M_pi;
    if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_138._M_pi)->_M_use_count = (local_138._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_138._M_pi)->_M_use_count = (local_138._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
    ::emplace_back<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>
              ((vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
                *)&vStack_210,
               (shared_ptr<Storage::MassStorage::MassStorageDevice> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x10000;
    if (local_140 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_140,&Storage::MassStorage::HFV::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *local_1f0 = *local_1f0 & uVar2;
      }
    }
    if (local_138._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_138._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_130 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::MassStorage::DSK,std::allocator<Storage::MassStorage::DSK>,std::__cxx11::string_const&>
              (&local_128,(DSK **)&local_130,(allocator<Storage::MassStorage::DSK> *)&local_268,
               local_1f8);
    local_280 = local_130;
    local_278 = local_128._M_pi;
    if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_128._M_pi)->_M_use_count = (local_128._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_128._M_pi)->_M_use_count = (local_128._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
    ::emplace_back<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>
              ((vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
                *)&vStack_210,
               (shared_ptr<Storage::MassStorage::MassStorageDevice> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x10000;
    if (local_130 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_130,&Storage::MassStorage::DSK::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *local_1f0 = *local_1f0 & uVar2;
      }
    }
    if (local_128._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_128._M_pi);
    }
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>>
            ((MediaAccumulator *)local_258,0x20000,"dsk");
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_120 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::OricMFMDSK>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::OricMFMDSK>>,std::__cxx11::string_const&>
              (&local_118,(DiskImageHolder<Storage::Disk::OricMFMDSK> **)&local_120,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::OricMFMDSK>_> *)&local_267,
               local_1f8);
    local_280 = local_120;
    local_278 = local_118._M_pi;
    if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_118._M_pi)->_M_use_count = (local_118._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_118._M_pi)->_M_use_count = (local_118._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x40000;
    if (local_120 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_120 + 0x70))
                        ((undefined1 *)((long)local_120 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
    }
    if (local_118._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_118._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_110 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::G64>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::G64>>,std::__cxx11::string_const&>
              (&local_108,(DiskImageHolder<Storage::Disk::G64> **)&local_110,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::G64>_> *)&local_266,
               local_1f8);
    local_280 = local_110;
    local_278 = local_108._M_pi;
    if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_108._M_pi)->_M_use_count = (local_108._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_108._M_pi)->_M_use_count = (local_108._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x1000;
    if (local_110 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_110 + 0x70))
                        ((undefined1 *)((long)local_110 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
    }
    if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_100 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::MassStorage::HDV,std::allocator<Storage::MassStorage::HDV>,std::__cxx11::string_const&>
              (&local_f8,(HDV **)&local_100,(allocator<Storage::MassStorage::HDV> *)&local_265,
               local_1f8);
    local_280 = local_100;
    local_278 = local_f8._M_pi;
    if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_f8._M_pi)->_M_use_count = (local_f8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_f8._M_pi)->_M_use_count = (local_f8._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
    ::emplace_back<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>
              ((vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>>>
                *)&vStack_210,
               (shared_ptr<Storage::MassStorage::MassStorageDevice> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 2;
    if (local_100 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_100,&Storage::MassStorage::HDV::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *local_1f0 = *local_1f0 & uVar2;
      }
    }
    if (local_f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f8._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_f0 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::HFE>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::HFE>>,std::__cxx11::string_const&>
              (&local_e8,(DiskImageHolder<Storage::Disk::HFE> **)&local_f0,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::HFE>_> *)&local_264,
               local_1f8);
    local_280 = local_f0;
    local_278 = local_e8._M_pi;
    if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_e8._M_pi)->_M_use_count = (local_e8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_e8._M_pi)->_M_use_count = (local_e8._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x241761;
    if (local_f0 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_f0 + 0x70))
                        ((undefined1 *)((long)local_f0 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
    }
    if (local_e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_e8._M_pi);
    }
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>>
            ((MediaAccumulator *)local_258,0x400000,"ima");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>
            ((MediaAccumulator *)local_258,0x460a7b,extension_03);
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  pcVar4 = extraout_RDX_16;
  if (iVar1 == 0) {
    local_e0 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::IMD>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::IMD>>,std::__cxx11::string_const&>
              (&local_d8,(DiskImageHolder<Storage::Disk::IMD> **)&local_e0,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::IMD>_> *)&local_263,
               local_1f8);
    local_280 = local_e0;
    local_278 = local_d8._M_pi;
    if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_d8._M_pi)->_M_use_count = (local_d8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_d8._M_pi)->_M_use_count = (local_d8._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    pcVar4 = extraout_RDX_17;
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
      pcVar4 = extraout_RDX_18;
    }
    *local_1f0 = *local_1f0 | 0x400000;
    if (local_e0 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_e0 + 0x70))
                        ((undefined1 *)((long)local_e0 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
      pcVar4 = extraout_RDX_19;
    }
    if (local_d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_d8._M_pi);
      pcVar4 = extraout_RDX_20;
    }
  }
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>
            ((MediaAccumulator *)local_258,0x4d701f,pcVar4);
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    (anonymous_namespace)::MediaAccumulator::
    insert<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>,std::__cxx11::string_const&>
              ((MediaAccumulator *)local_258,0x800000,file_name);
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_d0 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::IPF>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::IPF>>,std::__cxx11::string_const&>
              (&local_c8,(DiskImageHolder<Storage::Disk::IPF> **)&local_d0,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::IPF>_> *)&local_262,
               local_1f8);
    local_280 = local_d0;
    local_278 = local_c8._M_pi;
    if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_c8._M_pi)->_M_use_count = (local_c8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_c8._M_pi)->_M_use_count = (local_c8._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x200091;
    if (local_d0 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_d0 + 0x70))
                        ((undefined1 *)((long)local_d0 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
    }
    if (local_c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_c0 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::MSA>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::MSA>>,std::__cxx11::string_const&>
              (&local_b8,(DiskImageHolder<Storage::Disk::MSA> **)&local_c0,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::MSA>_> *)&local_261,
               local_1f8);
    local_280 = local_c0;
    local_278 = local_b8._M_pi;
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_b8._M_pi)->_M_use_count = (local_b8._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x10;
    if (local_c0 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_c0 + 0x70))
                        ((undefined1 *)((long)local_c0 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
    }
    if (local_b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b8._M_pi);
    }
  }
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_258,0x20000,"mx2");
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  pcVar4 = extraout_RDX_21;
  if (iVar1 == 0) {
    local_b0 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::NIB>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::NIB>>,std::__cxx11::string_const&>
              (&local_a8,(DiskImageHolder<Storage::Disk::NIB> **)&local_b0,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::NIB>_> *)&local_260,
               local_1f8);
    local_280 = local_b0;
    local_278 = local_a8._M_pi;
    if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_a8._M_pi)->_M_use_count = (local_a8._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    pcVar4 = extraout_RDX_22;
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
      pcVar4 = extraout_RDX_23;
    }
    *local_1f0 = *local_1f0 | 0x2000;
    if (local_b0 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_b0 + 0x70))
                        ((undefined1 *)((long)local_b0 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
      pcVar4 = extraout_RDX_24;
    }
    if (local_a8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a8._M_pi);
      pcVar4 = extraout_RDX_25;
    }
  }
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            ((MediaAccumulator *)local_258,0x460a61,pcVar4);
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            ((MediaAccumulator *)local_258,0x4e1416,extension_04);
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::AppleDSK>>
            ((MediaAccumulator *)local_258,0x460a95,extension_05);
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  pcVar4 = extraout_RDX_26;
  if (iVar1 == 0) {
    local_280 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )((ulong)local_280 & 0xffffffff00000000);
    local_40.
    super___shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>,std::__cxx11::string_const&,Storage::Disk::MacintoshIMG::FixedType>
              (&local_40.
                super___shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,(DiskImageHolder<Storage::Disk::MacintoshIMG> **)&local_40,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>_> *)&local_25f
               ,file_name,(FixedType *)&local_280);
    (anonymous_namespace)::MediaAccumulator::
    insert<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>>
              ((MediaAccumulator *)local_258,4,&local_40);
    pcVar4 = extraout_RDX_27;
    if (local_40.
        super___shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.
                 super___shared_ptr<Storage::Disk::DiskImageHolder<Storage::Disk::MacintoshIMG>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
      pcVar4 = extraout_RDX_28;
    }
  }
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Tape::ZX80O81P>
            ((MediaAccumulator *)local_258,0x460a98,pcVar4);
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_a0 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Cartridge::PRG,std::allocator<Storage::Cartridge::PRG>,std::__cxx11::string_const&>
              (&local_98,(PRG **)&local_a0,(allocator<Storage::Cartridge::PRG> *)&local_25e,
               file_name);
    local_280 = local_a0;
    local_278 = local_98._M_pi;
    if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_98._M_pi)->_M_use_count = (local_98._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Cartridge::Cartridge>,std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>>>
    ::emplace_back<std::shared_ptr<Storage::Cartridge::Cartridge>>
              ((vector<std::shared_ptr<Storage::Cartridge::Cartridge>,std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>>>
                *)&local_228,(shared_ptr<Storage::Cartridge::Cartridge> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x1000;
    if (local_a0 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_a0,&Storage::Cartridge::PRG::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *local_1f0 = *local_1f0 & uVar2;
      }
    }
    if (local_98._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98._M_pi);
    }
  }
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_258,0x20840,"rom");
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_258,0x8000,"sg");
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Cartridge::BinaryDump>
            ((MediaAccumulator *)local_258,0x8000,"sms");
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::SSD>>
            ((MediaAccumulator *)local_258,0x460aa3,extension_06);
  (anonymous_namespace)::MediaAccumulator::
  try_standard<Storage::Disk::DiskImageHolder<Storage::Disk::FAT12>>
            ((MediaAccumulator *)local_258,0x10,"st");
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_90 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::STX>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::STX>>,std::__cxx11::string_const&>
              (&local_88,(DiskImageHolder<Storage::Disk::STX> **)&local_90,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::STX>_> *)&local_25d,
               local_1f8);
    local_280 = local_90;
    local_278 = local_88._M_pi;
    if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_88._M_pi)->_M_use_count = (local_88._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x10;
    if (local_90 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_90 + 0x70))
                        ((undefined1 *)((long)local_90 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
    }
    if (local_88._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_88._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_80 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Tape::CommodoreTAP,std::allocator<Storage::Tape::CommodoreTAP>,std::__cxx11::string_const&>
              (&local_78,(CommodoreTAP **)&local_80,
               (allocator<Storage::Tape::CommodoreTAP> *)&local_25c,local_1f8);
    local_280 = local_80;
    local_278 = local_78._M_pi;
    if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_78._M_pi)->_M_use_count = (local_78._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&vStack_240,(shared_ptr<Storage::Tape::Tape> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x1000;
    if (local_80 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_80,&Storage::Tape::CommodoreTAP::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *local_1f0 = *local_1f0 & uVar2;
      }
    }
    if (local_78._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_70 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Tape::OricTAP,std::allocator<Storage::Tape::OricTAP>,std::__cxx11::string_const&>
              (&local_68,(OricTAP **)&local_70,(allocator<Storage::Tape::OricTAP> *)&local_25b,
               local_1f8);
    local_280 = local_70;
    local_278 = local_68._M_pi;
    if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_68._M_pi)->_M_use_count = (local_68._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&vStack_240,(shared_ptr<Storage::Tape::Tape> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x40000;
    if (local_70 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_70,&Storage::Tape::OricTAP::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *local_1f0 = *local_1f0 & uVar2;
      }
    }
    if (local_68._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_60 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Tape::ZXSpectrumTAP,std::allocator<Storage::Tape::ZXSpectrumTAP>,std::__cxx11::string_const&>
              (&local_58,(ZXSpectrumTAP **)&local_60,
               (allocator<Storage::Tape::ZXSpectrumTAP> *)&local_25a,local_1f8);
    local_280 = local_60;
    local_278 = local_58._M_pi;
    if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_58._M_pi)->_M_use_count = (local_58._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&vStack_240,(shared_ptr<Storage::Tape::Tape> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x200000;
    if (local_60 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      puVar3 = (undefined8 *)
               __dynamic_cast(local_60,&Storage::Tape::ZXSpectrumTAP::typeinfo,
                              &TargetPlatform::TypeDistinguisher::typeinfo,0xfffffffffffffffe);
      if (puVar3 != (undefined8 *)0x0) {
        uVar2 = (**(code **)*puVar3)(puVar3);
        *local_1f0 = *local_1f0 & uVar2;
      }
    }
    if (local_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58._M_pi);
    }
  }
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Tape::TZX>
            ((MediaAccumulator *)local_258,0x20000,"tsx");
  anon_unknown.dwarf_41c665::MediaAccumulator::try_standard<Storage::Tape::TZX>
            ((MediaAccumulator *)local_258,0x380000,"tzx");
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_50 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Tape::UEF,std::allocator<Storage::Tape::UEF>,std::__cxx11::string_const&>
              (&local_48,(UEF **)&local_50,(allocator<Storage::Tape::UEF> *)&local_259,local_1f8);
    local_280 = local_50;
    local_278 = local_48._M_pi;
    if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48._M_pi)->_M_use_count = (local_48._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
    ::emplace_back<std::shared_ptr<Storage::Tape::Tape>>
              ((vector<std::shared_ptr<Storage::Tape::Tape>,std::allocator<std::shared_ptr<Storage::Tape::Tape>>>
                *)&vStack_240,(shared_ptr<Storage::Tape::Tape> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x760;
    if (local_50 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_50 + 0x48))
                        ((undefined1 *)((long)local_50 + 0x48));
      *local_1f0 = *local_1f0 & uVar2;
    }
    if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
    }
  }
  iVar1 = std::__cxx11::string::compare((char *)&local_1e8);
  if (iVar1 == 0) {
    local_1c0 = (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
                 )0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>,std::allocator<Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>>,std::__cxx11::string_const&>
              (&local_1b8,(DiskImageHolder<Storage::Disk::WOZ> **)&local_1c0,
               (allocator<Storage::Disk::DiskImageHolder<Storage::Disk::WOZ>_> *)&local_280,
               local_1f8);
    local_280 = local_1c0;
    local_278 = local_1b8._M_pi;
    if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_1b8._M_pi)->_M_use_count = (local_1b8._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_1b8._M_pi)->_M_use_count = (local_1b8._M_pi)->_M_use_count + 1;
      }
    }
    std::
    vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
    ::emplace_back<std::shared_ptr<Storage::Disk::Disk>>
              ((vector<std::shared_ptr<Storage::Disk::Disk>,std::allocator<std::shared_ptr<Storage::Disk::Disk>>>
                *)local_258,(shared_ptr<Storage::Disk::Disk> *)&local_280._M_first);
    if (local_278 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_278);
    }
    *local_1f0 = *local_1f0 | 0x2000;
    if (local_1c0 !=
        (_Variadic_union<std::nullptr_t,_Storage::Disk::DiskImageHolderBase_*,_Storage::MassStorage::MassStorageDevice_*>
         )0x0) {
      uVar2 = (*(code *)**(undefined8 **)((long)local_1c0 + 0x70))
                        ((undefined1 *)((long)local_1c0 + 0x70));
      *local_1f0 = *local_1f0 & uVar2;
    }
    if (local_1b8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1b8._M_pi);
    }
  }
  std::
  vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ::vector(&__return_storage_ptr__->disks,
           (vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
            *)local_258);
  std::
  vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ::vector(&__return_storage_ptr__->tapes,&vStack_240);
  std::
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ::vector(&__return_storage_ptr__->cartridges,&local_228);
  std::
  vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ::vector(&__return_storage_ptr__->mass_storage_devices,&vStack_210);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::shared_ptr<Storage::MassStorage::MassStorageDevice>,_std::allocator<std::shared_ptr<Storage::MassStorage::MassStorageDevice>_>_>
  ::~vector(&vStack_210);
  std::
  vector<std::shared_ptr<Storage::Cartridge::Cartridge>,_std::allocator<std::shared_ptr<Storage::Cartridge::Cartridge>_>_>
  ::~vector(&local_228);
  std::
  vector<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
  ::~vector(&vStack_240);
  std::
  vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
  ::~vector((vector<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
             *)local_258);
  return extraout_RAX;
}

Assistant:

static Media GetMediaAndPlatforms(const std::string &file_name, TargetPlatform::IntType &potential_platforms) {
	MediaAccumulator accumulator(file_name, potential_platforms);

	// 2MG
	if(accumulator.name_matches("2mg")) {
		// 2MG uses a factory method; defer to it.
		try {
			const auto media = Disk::Disk2MG::open(file_name);
			std::visit([&](auto &&arg) {
				using Type = typename std::decay<decltype(arg)>::type;

				if constexpr (std::is_same<Type, std::nullptr_t>::value) {
					// It's valid for no media to be returned.
				} else if constexpr (std::is_same<Type, Disk::DiskImageHolderBase *>::value) {
					accumulator.insert(TargetPlatform::DiskII, std::shared_ptr<Disk::DiskImageHolderBase>(arg));
				} else if constexpr (std::is_same<Type, MassStorage::MassStorageDevice *>::value) {
					// TODO: or is it Apple IIgs?
					accumulator.insert(TargetPlatform::AppleII, std::shared_ptr<MassStorage::MassStorageDevice>(arg));
				} else {
					static_assert(always_false_v<Type>, "Unexpected type encountered.");
				}
			}, media);
		} catch(...) {}
	}

	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "80");
	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "81");

	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Atari2600, "a26");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AcornADF>>(TargetPlatform::Acorn, "adf");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AmigaADF>>(TargetPlatform::Amiga, "adf");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AcornADF>>(TargetPlatform::Acorn, "adl");

	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::AllCartridge, "bin");

	accumulator.try_standard<Tape::CAS>(TargetPlatform::MSX, "cas");
	accumulator.try_standard<Tape::TZX>(TargetPlatform::AmstradCPC, "cdt");
	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Coleco, "col");
	accumulator.try_standard<Tape::CSW>(TargetPlatform::AllTape, "csw");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::D64>>(TargetPlatform::Commodore, "d64");
	accumulator.try_standard<MassStorage::DAT>(TargetPlatform::Acorn, "dat");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::DMK>>(TargetPlatform::MSX, "dmk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AppleDSK>>(TargetPlatform::DiskII, "do");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::SSD>>(TargetPlatform::Acorn, "dsd");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::CPCDSK>>(
		TargetPlatform::AmstradCPC | TargetPlatform::Oric | TargetPlatform::ZXSpectrum, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AppleDSK>>(TargetPlatform::DiskII, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::MacintoshIMG>>(TargetPlatform::Macintosh, "dsk");
	accumulator.try_standard<MassStorage::HFV>(TargetPlatform::Macintosh, "dsk");
	accumulator.try_standard<MassStorage::DSK>(TargetPlatform::Macintosh, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::MSX, "dsk");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::OricMFMDSK>>(TargetPlatform::Oric, "dsk");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::G64>>(TargetPlatform::Commodore, "g64");

	accumulator.try_standard<MassStorage::HDV>(TargetPlatform::AppleII, "hdv");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::HFE>>(
		TargetPlatform::Acorn | TargetPlatform::AmstradCPC | TargetPlatform::Commodore | TargetPlatform::Oric | TargetPlatform::ZXSpectrum,
		"hfe");	// TODO: switch to AllDisk once the MSX stops being so greedy.

	accumulator.try_standard<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::PCCompatible, "ima");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::MacintoshIMG>>(TargetPlatform::Macintosh, "image");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::IMD>>(TargetPlatform::PCCompatible, "imd");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::MacintoshIMG>>(TargetPlatform::Macintosh, "img");

	// Treat PC booter as a potential backup only if this doesn't parse as a FAT12.
	if(accumulator.name_matches("img")) {
		try {
			accumulator.insert<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::FAT12, file_name);
		} catch(...) {
			accumulator.try_standard<Disk::DiskImageHolder<Disk::PCBooter>>(TargetPlatform::PCCompatible, "img");
		}
	}

	accumulator.try_standard<Disk::DiskImageHolder<Disk::IPF>>(
		TargetPlatform::Amiga | TargetPlatform::AtariST | TargetPlatform::AmstradCPC | TargetPlatform::ZXSpectrum,
		"ipf");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::MSA>>(TargetPlatform::AtariST, "msa");
	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::MSX, "mx2");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::NIB>>(TargetPlatform::DiskII, "nib");

	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "o");
	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "p");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::AppleDSK>>(TargetPlatform::DiskII, "po");

	if(accumulator.name_matches("po"))	{
		accumulator.try_insert<Disk::DiskImageHolder<Disk::MacintoshIMG>>(
			TargetPlatform::AppleIIgs,
			file_name, Disk::MacintoshIMG::FixedType::GCR);
	}

	accumulator.try_standard<Tape::ZX80O81P>(TargetPlatform::ZX8081, "p81");

	if(accumulator.name_matches("prg")) {
		// Try instantiating as a ROM; failing that accept as a tape.
		try {
			accumulator.insert<Cartridge::PRG>(TargetPlatform::Commodore, file_name);
		} catch(...) {
			try {
				accumulator.insert<Tape::PRG>(TargetPlatform::Commodore, file_name);
			} catch(...) {}
		}
	}

	accumulator.try_standard<Cartridge::BinaryDump>(
		TargetPlatform::AcornElectron | TargetPlatform::Coleco | TargetPlatform::MSX,
		"rom");

	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Sega, "sg");
	accumulator.try_standard<Cartridge::BinaryDump>(TargetPlatform::Sega, "sms");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::SSD>>(TargetPlatform::Acorn, "ssd");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::FAT12>>(TargetPlatform::AtariST, "st");
	accumulator.try_standard<Disk::DiskImageHolder<Disk::STX>>(TargetPlatform::AtariST, "stx");

	accumulator.try_standard<Tape::CommodoreTAP>(TargetPlatform::Commodore, "tap");
	accumulator.try_standard<Tape::OricTAP>(TargetPlatform::Oric, "tap");
	accumulator.try_standard<Tape::ZXSpectrumTAP>(TargetPlatform::ZXSpectrum, "tap");
	accumulator.try_standard<Tape::TZX>(TargetPlatform::MSX, "tsx");
	accumulator.try_standard<Tape::TZX>(TargetPlatform::ZX8081 | TargetPlatform::ZXSpectrum, "tzx");

	accumulator.try_standard<Tape::UEF>(TargetPlatform::Acorn, "uef");

	accumulator.try_standard<Disk::DiskImageHolder<Disk::WOZ>>(TargetPlatform::DiskII, "woz");

	return accumulator.media;
}